

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::routeMessage(FederateState *this,ActionMessage *msg)

{
  bool bVar1;
  action_t aVar2;
  ActionMessage *in_RSI;
  atomic<bool> *in_RDI;
  bool in_stack_00000163;
  int in_stack_00000164;
  FederateState *in_stack_00000168;
  undefined1 in_stack_00000170 [16];
  undefined1 in_stack_00000180 [16];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  memory_order in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  if (*(long *)(in_RDI + 0x2a8) == 0) {
    addAction((FederateState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              (ActionMessage *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    aVar2 = ActionMessage::action(in_RSI);
    if (aVar2 == cmd_time_request) {
      bVar1 = std::atomic::operator_cast_to_bool(in_RDI);
      if (!bVar1) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffd0,(char *)in_RDI);
        in_stack_ffffffffffffffb8 = 0;
        logMessage(in_stack_00000168,in_stack_00000164,(string_view)in_stack_00000180,
                   (string_view)in_stack_00000170,in_stack_00000163);
      }
    }
    aVar2 = ActionMessage::action(in_RSI);
    if (aVar2 == cmd_time_grant) {
      std::atomic<bool>::store
                (in_RDI,SUB41((uint)in_stack_ffffffffffffffc4 >> 0x18,0),in_stack_ffffffffffffffc0);
    }
    BrokerBase::addActionMessage
              ((BrokerBase *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (ActionMessage *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

void FederateState::routeMessage(const ActionMessage& msg)
{
    if (mParent != nullptr) {
        if (msg.action() == CMD_TIME_REQUEST && !requestingMode) {
            LOG_ERROR("sending time request in invalid state");
        }
        if (msg.action() == CMD_TIME_GRANT) {
            requestingMode.store(false);
        }
        mParent->addActionMessage(msg);
    } else {
        addAction(msg);
    }
}